

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<kj::Own<capnp::ClientHook>_> *
kj::newPromiseAndFulfiller<kj::Own<capnp::ClientHook>>(void)

{
  AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
  *pAVar1;
  PromiseFulfillerPair<kj::Own<capnp::ClientHook>_> *in_RDI;
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> wrapper;
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>_>
  local_28;
  
  _::WeakFulfiller<kj::Own<capnp::ClientHook>_>::make();
  heap<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>,kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>&>
            ((kj *)&local_28,local_48.ptr);
  pAVar1 = local_28.ptr;
  local_38.disposer = local_28.disposer;
  local_28.ptr = (AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
                  *)0x0;
  Own<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>_>
  ::dispose(&local_28);
  local_38.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.disposer = local_28.disposer;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
                  *)0x0;
  (in_RDI->fulfiller).disposer = local_48.disposer;
  (in_RDI->fulfiller).ptr = &(local_48.ptr)->super_PromiseFulfiller<kj::Own<capnp::ClientHook>_>;
  local_48.ptr = (WeakFulfiller<kj::Own<capnp::ClientHook>_> *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_>::dispose(&local_48);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}